

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnSelectExpr
          (BinaryReaderIR *this,Index result_count,Type *result_types)

{
  Result RVar1;
  pointer *__ptr;
  TypeVector results;
  Expr *local_48;
  _Head_base<0UL,_wabt::Expr_*,_false> local_40;
  void *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_38 = (void *)0x0;
  uStack_30 = 0;
  local_28 = 0;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_assign_aux<wabt::Type*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_38,result_types,
             result_types + result_count);
  MakeUnique<wabt::SelectExpr,std::vector<wabt::Type,std::allocator<wabt::Type>>&>
            ((wabt *)&local_48,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)&local_38);
  local_40._M_head_impl = local_48;
  local_48 = (Expr *)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_40);
  if (local_40._M_head_impl != (Expr *)0x0) {
    (*(local_40._M_head_impl)->_vptr_Expr[1])();
  }
  local_40._M_head_impl = (Expr *)0x0;
  if (local_48 != (Expr *)0x0) {
    (**(code **)(*(long *)local_48 + 8))();
  }
  if (local_38 != (void *)0x0) {
    operator_delete(local_38);
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnSelectExpr(Index result_count, Type* result_types) {
  TypeVector results;
  results.assign(result_types, result_types + result_count);
  return AppendExpr(MakeUnique<SelectExpr>(results));
}